

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void __thiscall addrman_tests::addrman_update_address::test_method(addrman_update_address *this)

{
  long lVar1;
  initializer_list<CAddress> __l;
  initializer_list<CAddress> __l_00;
  initializer_list<CAddress> __l_01;
  bool bVar2;
  strong_ordering sVar3;
  reference pvVar4;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffefb8;
  direct_or_indirect *in_stack_ffffffffffffefc0;
  char *in_stack_ffffffffffffefc8;
  _Optional_payload_base<bool> in_new;
  size_t in_stack_ffffffffffffefd0;
  _Optional_payload_base<Network> in_stack_ffffffffffffefd8;
  CService *in_stack_ffffffffffffefe0;
  CAddress *in_stack_ffffffffffffefe8;
  const_string *in_stack_ffffffffffffeff0;
  _Optional_payload_base<Network> in_stack_ffffffffffffeff8;
  iterator __s;
  string *in_stack_fffffffffffff008;
  string *in_stack_fffffffffffff010;
  undefined8 in_stack_fffffffffffff0a0;
  uint16_t port;
  undefined1 *puVar5;
  undefined1 *local_f58;
  undefined1 *local_e18;
  undefined1 *local_c88;
  addrman_update_address *this_local;
  direct_or_indirect local_b68;
  undefined1 local_b50 [68];
  direct_or_indirect local_b0c;
  undefined1 local_af0 [64];
  vector<CAddress,_std::allocator<CAddress>_> vAddr6;
  const_string local_a98 [2];
  lazy_ostream local_a78 [4];
  assertion_result local_a38 [2];
  direct_or_indirect local_a00;
  undefined1 local_9e8 [68];
  direct_or_indirect local_9a4;
  undefined1 local_988 [64];
  vector<CAddress,_std::allocator<CAddress>_> vAddr5;
  const_string local_930 [2];
  lazy_ostream local_910 [2];
  assertion_result local_8f0 [2];
  direct_or_indirect local_8b8;
  undefined1 local_8a0 [68];
  direct_or_indirect local_85c;
  undefined1 local_840 [64];
  vector<CAddress,_std::allocator<CAddress>_> vAddr4;
  direct_or_indirect local_7e8;
  undefined1 local_7d0 [68];
  direct_or_indirect local_78c;
  undefined1 local_770 [64];
  vector<CAddress,_std::allocator<CAddress>_> vAddr3;
  const_string local_718 [2];
  lazy_ostream local_6f8 [4];
  assertion_result local_6b8 [2];
  allocator<char> local_679;
  direct_or_indirect local_678;
  undefined1 local_660 [64];
  const_string local_620 [2];
  lazy_ostream local_600 [2];
  rep local_5d8;
  duration local_5d0;
  assertion_result local_5c8 [2];
  direct_or_indirect local_58c;
  undefined1 local_570 [64];
  vector<CAddress,_std::allocator<CAddress>_> vAddr2;
  direct_or_indirect local_518;
  undefined1 local_500 [64];
  const_string local_4c0 [2];
  lazy_ostream local_4a0 [2];
  assertion_result local_480 [2];
  direct_or_indirect local_444;
  undefined1 local_428 [64];
  vector<CAddress,_std::allocator<CAddress>_> vAddr1;
  allocator<char> local_3c9;
  undefined1 local_3c8 [8];
  undefined8 local_3c0;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [64];
  const_string local_368 [2];
  lazy_ostream local_348 [4];
  assertion_result local_308 [2];
  rep local_2d0;
  duration local_2c8;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> start_time;
  allocator<char> local_2b6;
  allocator<char> local_2b5;
  int32_t local_2b4;
  __single_object addrman;
  optional<Network> local_2a8;
  optional<Network> local_2a0;
  optional<Network> local_298;
  optional<Network> local_290;
  optional<Network> local_288;
  optional<Network> local_280;
  optional<Network> local_278;
  undefined1 local_270 [56];
  undefined1 local_238 [56];
  undefined1 local_200 [72];
  CAddress addr_v2;
  CAddress addr_diff_port;
  undefined1 local_100 [56];
  undefined1 local_c8 [72];
  CAddress addr;
  CNetAddr source;
  
  __s = (iterator)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_2b4 = GetCheckRatio((NodeContext *)in_stack_ffffffffffffeff8);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)in_stack_ffffffffffffeff0,(bool *)in_stack_ffffffffffffefe8,
             (int *)in_stack_ffffffffffffefe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff008,(char *)__s,(allocator<char> *)in_stack_ffffffffffffeff8);
  ResolveIP(in_stack_fffffffffffff010);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefb8);
  std::allocator<char>::~allocator(&local_2b5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff008,(char *)__s,(allocator<char> *)in_stack_ffffffffffffeff8);
  ResolveService(in_stack_fffffffffffff008,(uint16_t)((ulong)in_stack_fffffffffffff0a0 >> 0x30));
  CAddress::CAddress(in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                     (ServiceFlags)in_stack_ffffffffffffefd8);
  CService::~CService((CService *)in_stack_ffffffffffffefb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefb8);
  std::allocator<char>::~allocator(&local_2b6);
  local_2c8.__r =
       (rep)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  local_2d0 = (rep)s<(char)49,(char)48,(char)48,(char)48,(char)48>();
  start_time = std::chrono::operator-
                         ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                           *)&in_stack_ffffffffffffefc0->indirect_contents,
                          (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffefb8);
  addr.nTime.__d.__r = (duration)(duration)start_time;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
    CAddress::CAddress((CAddress *)in_stack_ffffffffffffefc8,
                       (CAddress *)&in_stack_ffffffffffffefc0->indirect_contents);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffefb8);
    __l._M_len = (size_type)in_stack_fffffffffffff008;
    __l._M_array = __s;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffeff8,__l,
               (allocator_type *)in_stack_ffffffffffffeff0);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffefc8,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffefc0->indirect_contents,(CNetAddr *)in_stack_ffffffffffffefb8
                 ,(seconds)in_stack_ffffffffffffefd8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffefc8,
               SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    in_stack_ffffffffffffefb8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_308,local_348,local_368,0x43c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffefb8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffefb8);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffefb8);
    local_c88 = local_c8;
    do {
      local_c88 = local_c88 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffefb8);
    } while (local_c88 != local_100);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    in_new = SUB82((ulong)in_stack_ffffffffffffefc8 >> 0x30,0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
    std::optional<Network>::optional(&local_278);
    std::optional<bool>::optional((optional<bool> *)(local_3c8 + 6));
    local_3c0 = AddrMan::Size((AddrMan *)&in_stack_ffffffffffffefc0->indirect_contents,
                              (optional<Network>)in_stack_ffffffffffffefd8,(optional<bool>)in_new);
    local_3c8._0_4_ = 1;
    in_stack_ffffffffffffefc8 = "1U";
    in_stack_ffffffffffffefc0 = (direct_or_indirect *)local_3c8;
    in_stack_ffffffffffffefb8 = "addrman->Size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_3a8,local_3b8,0x43d,1,2,&local_3c0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff008,(char *)__s,(allocator<char> *)in_stack_ffffffffffffeff8);
  ResolveService(in_stack_fffffffffffff008,(uint16_t)((ulong)in_stack_fffffffffffff0a0 >> 0x30));
  CAddress::CAddress(in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                     (ServiceFlags)in_stack_ffffffffffffefd8);
  CService::~CService((CService *)in_stack_ffffffffffffefb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefb8);
  std::allocator<char>::~allocator(&local_3c9);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  AddrMan::Connected((AddrMan *)in_stack_ffffffffffffefb8,(CService *)0x326d8d,
                     (NodeSeconds)in_stack_ffffffffffffefc8);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
  AddrMan::SetServices
            ((AddrMan *)in_stack_ffffffffffffefc8,
             (CService *)&in_stack_ffffffffffffefc0->indirect_contents,
             (ServiceFlags)in_stack_ffffffffffffefb8);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
  std::optional<Network>::optional(&local_280);
  AddrMan::GetAddr((AddrMan *)in_stack_ffffffffffffefe0,(size_t)in_stack_ffffffffffffefd8,
                   in_stack_ffffffffffffefd0,(optional<Network>)in_stack_ffffffffffffeff8,
                   SUB81((ulong)in_stack_ffffffffffffefc8 >> 0x38,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    local_444._4_8_ =
         std::vector<CAddress,_std::allocator<CAddress>_>::size
                   ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefb8);
    local_444._0_4_ = 1;
    in_stack_ffffffffffffefc8 = "1U";
    in_stack_ffffffffffffefc0 = &local_444;
    in_stack_ffffffffffffefb8 = "vAddr1.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_428,local_444.direct + 0xc,0x445,1,2,local_444.direct + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    std::vector<CAddress,_std::allocator<CAddress>_>::at
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8,
               (size_type)in_stack_ffffffffffffefc0);
    std::chrono::operator==
              ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               in_stack_ffffffffffffefc8,
               (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               &in_stack_ffffffffffffefc0->indirect_contents);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffefc8,
               SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    in_stack_ffffffffffffefb8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_480,local_4a0,local_4c0,0x446,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffefb8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    pvVar4 = std::vector<CAddress,_std::allocator<CAddress>_>::at
                       ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8,
                        (size_type)in_stack_ffffffffffffefc0);
    local_518.indirect_contents.indirect = (char *)0x0;
    in_stack_ffffffffffffefc8 = "NODE_NONE";
    in_stack_ffffffffffffefc0 = &local_518;
    in_stack_ffffffffffffefb8 = "vAddr1.at(0).nServices";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ServiceFlags,ServiceFlags>
              (local_500,local_518.direct + 8,0x447,1,2,&pvVar4->nServices);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
  Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  AddrMan::Connected((AddrMan *)in_stack_ffffffffffffefb8,(CService *)0x327278,
                     (NodeSeconds)in_stack_ffffffffffffefc8);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
  AddrMan::SetServices
            ((AddrMan *)in_stack_ffffffffffffefc8,
             (CService *)&in_stack_ffffffffffffefc0->indirect_contents,
             (ServiceFlags)in_stack_ffffffffffffefb8);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
  std::optional<Network>::optional(&local_288);
  AddrMan::GetAddr((AddrMan *)in_stack_ffffffffffffefe0,(size_t)in_stack_ffffffffffffefd8,
                   in_stack_ffffffffffffefd0,(optional<Network>)in_stack_ffffffffffffeff8,
                   SUB81((ulong)in_stack_ffffffffffffefc8 >> 0x38,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    local_58c._4_8_ =
         std::vector<CAddress,_std::allocator<CAddress>_>::size
                   ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefb8);
    local_58c._0_4_ = 1;
    in_stack_ffffffffffffefc8 = "1U";
    in_stack_ffffffffffffefc0 = &local_58c;
    in_stack_ffffffffffffefb8 = "vAddr2.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_570,local_58c.direct + 0xc,0x44d,1,2,local_58c.direct + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    std::vector<CAddress,_std::allocator<CAddress>_>::at
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8,
               (size_type)in_stack_ffffffffffffefc0);
    local_5d8 = (rep)s<(char)49,(char)48,(char)48,(char)48,(char)48>();
    local_5d0.__r =
         (rep)std::chrono::operator+
                        ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )&in_stack_ffffffffffffefc0->indirect_contents,
                         (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffefb8);
    sVar3 = std::chrono::
            operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                      ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                       &in_stack_ffffffffffffefc0->indirect_contents,
                       (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                       in_stack_ffffffffffffefb8);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_ffffffffffffefb8,(__unspec *)0x32754b);
    std::operator>=(sVar3._M_value);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffefc8,
               SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    in_stack_ffffffffffffefb8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5c8,local_600,local_620,0x44e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffefb8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    pvVar4 = std::vector<CAddress,_std::allocator<CAddress>_>::at
                       ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8,
                        (size_type)in_stack_ffffffffffffefc0);
    local_678.indirect_contents.indirect = (char *)0x400;
    in_stack_ffffffffffffefc8 = "NODE_NETWORK_LIMITED";
    in_stack_ffffffffffffefc0 = &local_678;
    in_stack_ffffffffffffefb8 = "vAddr2.at(0).nServices";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ServiceFlags,ServiceFlags>
              (local_660,local_678.direct + 8,0x44f,1,2,&pvVar4->nServices);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    port = (uint16_t)((ulong)in_stack_fffffffffffff0a0 >> 0x30);
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff008,(char *)__s,(allocator<char> *)in_stack_ffffffffffffeff8);
  ResolveService(in_stack_fffffffffffff008,port);
  CAddress::CAddress(in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                     (ServiceFlags)in_stack_ffffffffffffefd8);
  CService::~CService((CService *)in_stack_ffffffffffffefb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffefb8);
  std::allocator<char>::~allocator(&local_679);
  addr_v2.nTime.__d.__r = start_time.__d.__r;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
    CAddress::CAddress((CAddress *)in_stack_ffffffffffffefc8,
                       (CAddress *)&in_stack_ffffffffffffefc0->indirect_contents);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffefb8);
    __l_00._M_len = (size_type)in_stack_fffffffffffff008;
    __l_00._M_array = __s;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffeff8,__l_00,
               (allocator_type *)in_stack_ffffffffffffeff0);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffefc8,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffefc0->indirect_contents,(CNetAddr *)in_stack_ffffffffffffefb8
                 ,(seconds)in_stack_ffffffffffffefd8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffefc8,
               SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    in_stack_ffffffffffffefb8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6b8,local_6f8,local_718,0x454,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffefb8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffefb8);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffefb8);
    local_e18 = local_200;
    do {
      local_e18 = local_e18 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffefb8);
    } while (local_e18 != local_238);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
  std::optional<Network>::optional(&local_290);
  AddrMan::GetAddr((AddrMan *)in_stack_ffffffffffffefe0,(size_t)in_stack_ffffffffffffefd8,
                   in_stack_ffffffffffffefd0,(optional<Network>)in_stack_ffffffffffffeff8,
                   SUB81((ulong)in_stack_ffffffffffffefc8 >> 0x38,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    local_78c._4_8_ =
         std::vector<CAddress,_std::allocator<CAddress>_>::size
                   ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefb8);
    local_78c._0_4_ = 1;
    in_stack_ffffffffffffefc8 = "1U";
    in_stack_ffffffffffffefc0 = &local_78c;
    in_stack_ffffffffffffefb8 = "vAddr3.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_770,local_78c.direct + 0xc,0x456,1,2,local_78c.direct + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    pvVar4 = std::vector<CAddress,_std::allocator<CAddress>_>::at
                       ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8,
                        (size_type)in_stack_ffffffffffffefc0);
    local_7e8.indirect_contents.indirect = (char *)0xc00;
    in_stack_ffffffffffffefc8 = "NODE_P2P_V2 | NODE_NETWORK_LIMITED";
    in_stack_ffffffffffffefc0 = &local_7e8;
    in_stack_ffffffffffffefb8 = "vAddr3.at(0).nServices";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ServiceFlags,unsigned_long>
              (local_7d0,local_7e8.direct + 8,0x457,1,2,&pvVar4->nServices);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
  AddrMan::SetServices
            ((AddrMan *)in_stack_ffffffffffffefc8,
             (CService *)&in_stack_ffffffffffffefc0->indirect_contents,
             (ServiceFlags)in_stack_ffffffffffffefb8);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
  std::optional<Network>::optional(&local_298);
  AddrMan::GetAddr((AddrMan *)in_stack_ffffffffffffefe0,(size_t)in_stack_ffffffffffffefd8,
                   in_stack_ffffffffffffefd0,(optional<Network>)in_stack_ffffffffffffeff8,
                   SUB81((ulong)in_stack_ffffffffffffefc8 >> 0x38,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    local_85c._4_8_ =
         std::vector<CAddress,_std::allocator<CAddress>_>::size
                   ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefb8);
    local_85c._0_4_ = 1;
    in_stack_ffffffffffffefc8 = "1U";
    in_stack_ffffffffffffefc0 = &local_85c;
    in_stack_ffffffffffffefb8 = "vAddr4.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_840,local_85c.direct + 0xc,0x45c,1,2,local_85c.direct + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    pvVar4 = std::vector<CAddress,_std::allocator<CAddress>_>::at
                       ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8,
                        (size_type)in_stack_ffffffffffffefc0);
    local_8b8.indirect_contents.indirect = (char *)0x1;
    in_stack_ffffffffffffefc8 = "NODE_NETWORK";
    in_stack_ffffffffffffefc0 = &local_8b8;
    in_stack_ffffffffffffefb8 = "vAddr4.at(0).nServices";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ServiceFlags,ServiceFlags>
              (local_8a0,local_8b8.direct + 8,0x45d,1,2,&pvVar4->nServices);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
    Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    AddrMan::Good((AddrMan *)in_stack_ffffffffffffefc8,
                  (CService *)&in_stack_ffffffffffffefc0->indirect_contents,
                  (NodeSeconds)in_stack_ffffffffffffefd8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffefc8,
               SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    in_stack_ffffffffffffefb8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8f0,local_910,local_930,0x460,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffefb8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
  std::optional<Network>::optional(&local_2a0);
  AddrMan::GetAddr((AddrMan *)in_stack_ffffffffffffefe0,(size_t)in_stack_ffffffffffffefd8,
                   in_stack_ffffffffffffefd0,(optional<Network>)in_stack_ffffffffffffeff8,
                   SUB81((ulong)in_stack_ffffffffffffefc8 >> 0x38,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    local_9a4._4_8_ =
         std::vector<CAddress,_std::allocator<CAddress>_>::size
                   ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefb8);
    local_9a4._0_4_ = 1;
    in_stack_ffffffffffffefc8 = "1U";
    in_stack_ffffffffffffefc0 = &local_9a4;
    in_stack_ffffffffffffefb8 = "vAddr5.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_988,local_9a4.direct + 0xc,0x462,1,2,local_9a4.direct + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    pvVar4 = std::vector<CAddress,_std::allocator<CAddress>_>::at
                       ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8,
                        (size_type)in_stack_ffffffffffffefc0);
    local_a00.indirect_contents.indirect = (char *)0x1;
    in_stack_ffffffffffffefc8 = "NODE_NETWORK";
    in_stack_ffffffffffffefc0 = &local_a00;
    in_stack_ffffffffffffefb8 = "vAddr5.at(0).nServices";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ServiceFlags,ServiceFlags>
              (local_9e8,local_a00.direct + 8,0x463,1,2,&pvVar4->nServices);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
              ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
    CAddress::CAddress((CAddress *)in_stack_ffffffffffffefc8,
                       (CAddress *)&in_stack_ffffffffffffefc0->indirect_contents);
    std::allocator<CAddress>::allocator((allocator<CAddress> *)in_stack_ffffffffffffefb8);
    __l_01._M_len = (size_type)in_stack_fffffffffffff008;
    __l_01._M_array = __s;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffeff8,__l_01,
               (allocator_type *)in_stack_ffffffffffffeff0);
    s<(char)48>();
    AddrMan::Add((AddrMan *)in_stack_ffffffffffffefc8,
                 (vector<CAddress,_std::allocator<CAddress>_> *)
                 &in_stack_ffffffffffffefc0->indirect_contents,(CNetAddr *)in_stack_ffffffffffffefb8
                 ,(seconds)in_stack_ffffffffffffefd8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffefc8,
               SUB81((ulong)in_stack_ffffffffffffefc0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    in_stack_ffffffffffffefb8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a38,local_a78,local_a98,0x466,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffefb8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffefb8);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8);
    std::allocator<CAddress>::~allocator((allocator<CAddress> *)in_stack_ffffffffffffefb8);
    puVar5 = local_270;
    local_f58 = local_238;
    do {
      local_f58 = local_f58 + -0x38;
      CAddress::~CAddress((CAddress *)in_stack_ffffffffffffefb8);
    } while (local_f58 != puVar5);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator->
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefb8);
  std::optional<Network>::optional(&local_2a8);
  AddrMan::GetAddr((AddrMan *)in_stack_ffffffffffffefe0,(size_t)in_stack_ffffffffffffefd8,
                   in_stack_ffffffffffffefd0,(optional<Network>)in_stack_ffffffffffffeff8,
                   SUB81((ulong)in_stack_ffffffffffffefc8 >> 0x38,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    local_b0c._4_8_ =
         std::vector<CAddress,_std::allocator<CAddress>_>::size
                   ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefb8);
    local_b0c._0_4_ = 1;
    in_stack_ffffffffffffefc8 = "1U";
    in_stack_ffffffffffffefc0 = &local_b0c;
    in_stack_ffffffffffffefb8 = "vAddr6.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_af0,local_b0c.direct + 0xc,0x468,1,2,local_b0c.direct + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
               (size_t)in_stack_ffffffffffffefe8,(const_string *)in_stack_ffffffffffffefe0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_ffffffffffffefc0->indirect_contents,
               (char (*) [1])in_stack_ffffffffffffefb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffefc8,
               in_stack_ffffffffffffefc0->direct,(unsigned_long)in_stack_ffffffffffffefb8);
    pvVar4 = std::vector<CAddress,_std::allocator<CAddress>_>::at
                       ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8,
                        (size_type)in_stack_ffffffffffffefc0);
    local_b68.indirect_contents.indirect = (char *)0x801;
    in_stack_ffffffffffffefc8 = "NODE_NETWORK | NODE_P2P_V2";
    in_stack_ffffffffffffefc0 = &local_b68;
    in_stack_ffffffffffffefb8 = "vAddr6.at(0).nServices";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ServiceFlags,unsigned_long>
              (local_b50,local_b68.direct + 8,0x469,1,2,&pvVar4->nServices);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffefb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8);
  CAddress::~CAddress((CAddress *)in_stack_ffffffffffffefb8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_ffffffffffffefc8);
  CAddress::~CAddress((CAddress *)in_stack_ffffffffffffefb8);
  CAddress::~CAddress((CAddress *)in_stack_ffffffffffffefb8);
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_ffffffffffffefb8);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
            ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)in_stack_ffffffffffffefc8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_update_address)
{
    // Tests updating nTime via Connected() and nServices via SetServices() and Add()
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    CNetAddr source{ResolveIP("252.2.2.2")};
    CAddress addr{CAddress(ResolveService("250.1.1.1", 8333), NODE_NONE)};

    const auto start_time{Now<NodeSeconds>() - 10000s};
    addr.nTime = start_time;
    BOOST_CHECK(addrman->Add({addr}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    // Updating an addrman entry with a different port doesn't change it
    CAddress addr_diff_port{CAddress(ResolveService("250.1.1.1", 8334), NODE_NONE)};
    addr_diff_port.nTime = start_time;
    addrman->Connected(addr_diff_port);
    addrman->SetServices(addr_diff_port, NODE_NETWORK_LIMITED);
    std::vector<CAddress> vAddr1{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr1.size(), 1U);
    BOOST_CHECK(vAddr1.at(0).nTime == start_time);
    BOOST_CHECK_EQUAL(vAddr1.at(0).nServices, NODE_NONE);

    // Updating an addrman entry with the correct port is successful
    addrman->Connected(addr);
    addrman->SetServices(addr, NODE_NETWORK_LIMITED);
    std::vector<CAddress> vAddr2 = addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt);
    BOOST_CHECK_EQUAL(vAddr2.size(), 1U);
    BOOST_CHECK(vAddr2.at(0).nTime >= start_time + 10000s);
    BOOST_CHECK_EQUAL(vAddr2.at(0).nServices, NODE_NETWORK_LIMITED);

    // Updating an existing addr through Add() (used in gossip relay) can add additional services but can't remove existing ones.
    CAddress addr_v2{CAddress(ResolveService("250.1.1.1", 8333), NODE_P2P_V2)};
    addr_v2.nTime = start_time;
    BOOST_CHECK(!addrman->Add({addr_v2}, source));
    std::vector<CAddress> vAddr3{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr3.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr3.at(0).nServices, NODE_P2P_V2 | NODE_NETWORK_LIMITED);

    // SetServices() (used when we connected to them) overwrites existing service flags
    addrman->SetServices(addr, NODE_NETWORK);
    std::vector<CAddress> vAddr4{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr4.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr4.at(0).nServices, NODE_NETWORK);

    // Promoting to Tried does not affect the service flags
    BOOST_CHECK(addrman->Good(addr)); // addr has NODE_NONE
    std::vector<CAddress> vAddr5{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr5.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr5.at(0).nServices, NODE_NETWORK);

    // Adding service flags even works when the addr is in Tried
    BOOST_CHECK(!addrman->Add({addr_v2}, source));
    std::vector<CAddress> vAddr6{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr6.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr6.at(0).nServices, NODE_NETWORK | NODE_P2P_V2);
}